

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::SwapRandom(AddrManImpl *this,uint nRndPos1,uint nRndPos2)

{
  long lVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  pointer pvVar5;
  uint in_EDX;
  uint in_ESI;
  long in_FS_OFFSET;
  bool bVar6;
  const_iterator it_2;
  const_iterator it_1;
  nid_type nId2;
  nid_type nId1;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff88;
  vector<long,_std::allocator<long>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff88,
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,(AnnotatedMixin<std::mutex> *)0xee432b);
  if (in_ESI != in_EDX) {
    sVar3 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar6 = false;
    if (in_ESI < sVar3) {
      sVar3 = std::vector<long,_std::allocator<long>_>::size
                        ((vector<long,_std::allocator<long>_> *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      bVar6 = in_EDX < sVar3;
    }
    if (!bVar6) {
      __assert_fail("nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1b7,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                       (in_stack_ffffffffffffff88,
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    vVar2 = *pvVar4;
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                       (in_stack_ffffffffffffff88,
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    this_00 = (vector<long,_std::allocator<long>_> *)*pvVar4;
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar6 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       in_stack_ffffffffffffff88,
                       (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      __assert_fail("it_1 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1be,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar6 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       in_stack_ffffffffffffff88,
                       (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      __assert_fail("it_2 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1bf,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    pvVar5 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    (pvVar5->second).nRandomPos = in_EDX;
    pvVar5 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    (pvVar5->second).nRandomPos = in_ESI;
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](this_00,CONCAT44(in_ESI,in_EDX));
    *pvVar4 = (value_type)this_00;
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](this_00,CONCAT44(in_ESI,in_EDX));
    *pvVar4 = vVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::SwapRandom(unsigned int nRndPos1, unsigned int nRndPos2) const
{
    AssertLockHeld(cs);

    if (nRndPos1 == nRndPos2)
        return;

    assert(nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size());

    nid_type nId1 = vRandom[nRndPos1];
    nid_type nId2 = vRandom[nRndPos2];

    const auto it_1{mapInfo.find(nId1)};
    const auto it_2{mapInfo.find(nId2)};
    assert(it_1 != mapInfo.end());
    assert(it_2 != mapInfo.end());

    it_1->second.nRandomPos = nRndPos2;
    it_2->second.nRandomPos = nRndPos1;

    vRandom[nRndPos1] = nId2;
    vRandom[nRndPos2] = nId1;
}